

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_concurrency.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_24f1a::
ARTConcurrencyTest_ParallelInsertOneTree_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTConcurrencyTest_ParallelInsertOneTree_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  qsbr_per_thread *pqVar1;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_00;
  long lVar2;
  thread local_80;
  undefined1 auStack_78 [8];
  array<unodb::qsbr_thread,_4UL> threads;
  _func_void_tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_ptr_unsigned_long_unsigned_long
  *local_50;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_48;
  unsigned_long local_40;
  ulong local_38;
  
  this_00 = &(this->
             super_ARTConcurrencyTest<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             ).verifier;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::preinsert_key_range_to_verifier_only<int>(this_00,0,0x400);
  local_50 = ARTConcurrencyTest<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             ::parallel_insert_thread;
  pqVar1 = unodb::qsbr_per_thread::get_instance();
  unodb::qsbr_per_thread::qsbr_pause(pqVar1);
  auStack_78 = (undefined1  [8])0x0;
  threads._M_elems[0].super_thread._M_id._M_thread = (thread)(id)0x0;
  threads._M_elems[1].super_thread._M_id._M_thread = (thread)(id)0x0;
  threads._M_elems[2].super_thread._M_id._M_thread = (thread)(id)0x0;
  for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
    local_40 = 0x100;
    local_48 = this_00;
    unodb::qsbr_thread::
    qsbr_thread<void_(*&)(unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_*,_unsigned_long,_unsigned_long),_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_*,_unsigned_long_&,_unsigned_long>
              ((qsbr_thread *)&local_80,&local_50,&local_48,&local_38,&local_40);
    std::thread::operator=(&threads._M_elems[local_38 - 1].super_thread,&local_80);
    std::thread::~thread(&local_80);
  }
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
    std::thread::join();
  }
  pqVar1 = unodb::qsbr_per_thread::get_instance();
  unodb::qsbr_per_thread::qsbr_resume(pqVar1);
  std::array<unodb::qsbr_thread,_4UL>::~array((array<unodb::qsbr_thread,_4UL> *)auStack_78);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values(this_00);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTConcurrencyTest, ParallelInsertOneTree) {
  constexpr auto thread_count = 4;
  constexpr auto total_keys = 1024;
  constexpr auto ops_per_thread = total_keys / thread_count;

  this->verifier.preinsert_key_range_to_verifier_only(0, total_keys);
  this->template parallel_test<thread_count, ops_per_thread>(
      TestFixture::parallel_insert_thread);
  this->verifier.check_present_values();
}